

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomUrl::write(DomUrl *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomString *this_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  QVar2.field_0._4_4_ = in_register_00000034;
  QVar2.field_0._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    local_40.ptr = L"url";
    local_40.size = 3;
  }
  else {
    QString::toLower_helper((QString *)&local_40);
  }
  QVar2.m_size = (size_t)local_40.ptr;
  QXmlStreamWriter::writeStartElement(QVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if ((this->m_children & 1) != 0) {
    this_00 = this->m_string;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"string",6);
    DomString::write(this_00,__fd,&local_40,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomUrl::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("url") : tagName.toLower());

    if (m_children & String)
        m_string->write(writer, u"string"_s);

    writer.writeEndElement();
}